

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::UnsymbolizedSourceLocation::UnsymbolizedSourceLocation
          (UnsymbolizedSourceLocation *this,UnsymbolizedSourceLocation *param_1)

{
  UnsymbolizedSourceLocation *param_1_local;
  UnsymbolizedSourceLocation *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__UnsymbolizedSourceLocation_009c22c8;
  this->iid_ = param_1->iid_;
  this->mapping_id_ = param_1->mapping_id_;
  this->rel_pc_ = param_1->rel_pc_;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

UnsymbolizedSourceLocation::UnsymbolizedSourceLocation(UnsymbolizedSourceLocation&&) noexcept = default;